

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDebugger.cpp
# Opt level: O1

void __thiscall moira::Guards::removeAt(Guards *this,u32 addr)

{
  undefined8 *puVar1;
  Guard *pGVar2;
  undefined8 uVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  
  if (0 < this->count) {
    lVar4 = 0x18;
    uVar5 = 0;
    do {
      if (*(u32 *)((long)&this->guards[-1].addr + lVar4) == addr) {
        lVar7 = this->count;
        if ((long)(ulong)((int)uVar5 + 1) < lVar7) {
          do {
            pGVar2 = this->guards;
            pGVar2[uVar5 & 0xffffffff].skip = *(long *)((long)&pGVar2->skip + lVar4);
            puVar1 = (undefined8 *)((long)&pGVar2->addr + lVar4);
            uVar3 = *puVar1;
            lVar7 = puVar1[1];
            pGVar2 = pGVar2 + (uVar5 & 0xffffffff);
            pGVar2->addr = (int)uVar3;
            pGVar2->enabled = (bool)(char)((ulong)uVar3 >> 0x20);
            *(int3 *)&pGVar2->field_0x5 = (int3)((ulong)uVar3 >> 0x28);
            pGVar2->hits = lVar7;
            lVar7 = this->count;
            lVar4 = lVar4 + 0x18;
            lVar6 = uVar5 + 2;
            uVar5 = uVar5 + 1;
          } while (lVar6 < lVar7);
        }
        this->count = lVar7 + -1;
        break;
      }
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x18;
    } while (this->count != uVar5);
  }
  (*this->_vptr_Guards[2])(this,(ulong)(this->count != 0));
  return;
}

Assistant:

void
Guards::removeAt(u32 addr)
{
    for (int i = 0; i < count; i++) {

        if (guards[i].addr == addr) {

            for (int j = i; j + 1 < count; j++) guards[j] = guards[j + 1];
            count--;
            break;
        }
    }
    setNeedsCheck(count != 0);
}